

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  float *gray_image;
  integral_image *piVar2;
  fasthessian *fh;
  FILE *__stream;
  size_t j;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int channels;
  int height;
  int width;
  vector<interest_point,_std::allocator<interest_point>_> interest_points;
  uint local_64;
  int local_60;
  int local_5c;
  vector<interest_point,_std::allocator<interest_point>_> local_58;
  integral_image *local_40;
  float *local_38;
  
  if (argc == 3) {
    stbi__l2h_gamma = 1.0;
    gray_image = stbi_loadf(argv[1],&local_5c,&local_60,(int *)&local_64,1);
    if (gray_image == (float *)0x0) {
      puts("Could not open or find image");
      iVar1 = -1;
    }
    else {
      piVar2 = create_integral_img(local_5c,local_60);
      local_38 = gray_image;
      compute_integral_img(gray_image,piVar2);
      fh = create_fast_hessian(piVar2);
      create_response_map(fh);
      compute_response_layers(fh);
      local_58.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      get_interest_points(fh,&local_58);
      get_msurf_descriptors(piVar2,&local_58);
      __stream = fopen(argv[2],"w");
      local_40 = piVar2;
      printf("%d %d %d\n",(ulong)(uint)piVar2->width,(ulong)(uint)piVar2->height,(ulong)local_64);
      if (local_58.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_58.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar4 = 0x14;
        uVar5 = 0;
        do {
          fprintf(__stream,"%f %f %f %d ",
                  (double)local_58.
                          super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar5].x,
                  (double)local_58.
                          super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar5].y,
                  (double)local_58.
                          super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar5].scale,
                  (ulong)local_58.
                         super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl
                         .super__Vector_impl_data._M_start[uVar5].laplacian);
          lVar3 = 0;
          do {
            fprintf(__stream,"%f ",
                    (double)*(float *)((long)(local_58.
                                              super__Vector_base<interest_point,_std::allocator<interest_point>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->descriptor
                                      + lVar3 * 4 + lVar4 + -0x14));
            lVar3 = lVar3 + 1;
          } while (lVar3 != 0x40);
          fputc(10,__stream);
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x114;
        } while (uVar5 < (ulong)(((long)local_58.
                                        super__Vector_base<interest_point,_std::allocator<interest_point>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_58.
                                        super__Vector_base<interest_point,_std::allocator<interest_point>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                -0xed7303b5cc0ed73));
      }
      fclose(__stream);
      free(local_38);
      piVar2 = local_40;
      free(local_40->padded_data);
      free(piVar2);
      lVar4 = 1;
      do {
        free(fh->response_map[lVar4 + -1]->response);
        free(fh->response_map[lVar4 + -1]->laplacian);
        free(fh->response_map[lVar4 + -1]);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 5);
      free(fh);
      if (local_58.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<interest_point,_std::allocator<interest_point>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      iVar1 = 0;
    }
  }
  else {
    puts("Invaid argument count.\nUsage:\n\t./surf image_path descriptor_file_target_path");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char const *argv[])
{
    if (argc != 3) {
        printf("Invaid argument count.\nUsage:\n\t./surf image_path descriptor_file_target_path\n");
        return 1;
    }
	int width, height, channels;

	// Load image
	stbi_ldr_to_hdr_gamma(1.0f);
	float* image = stbi_loadf(argv[1], &width, &height, &channels, STBI_grey);

    if (!image) {
		printf("Could not open or find image\n");
        return -1;
    }

	// Create integral image
	struct integral_image* iimage = create_integral_img(width, height);
	// Compute integral image
	compute_integral_img(image, iimage);

	// Fast-Hessian
	struct fasthessian* fh = create_fast_hessian(iimage);

	// Create octaves with response layers
	create_response_map(fh);

	// Compute responses for every layer
	compute_response_layers(fh);

	// Getting interest points with non-maximum supression
	std::vector<struct interest_point> interest_points;
	get_interest_points(fh, &interest_points);

    // printf("interest points: %lu\n", interest_points.size());

	// Getting M-SURF descriptors for each interest point
	get_msurf_descriptors(iimage, &interest_points);

	// Write results to file
    FILE * fp = fopen(argv[2],"w");
    printf("%d %d %d\n", iimage->width, iimage->height, channels);
	for (size_t i=0; i<interest_points.size(); ++i) {
        fprintf(fp, "%f %f %f %d ", interest_points[i].x, interest_points[i].y, interest_points[i].scale, interest_points[i].laplacian);
        for(size_t j = 0; j < 64; j++) {
            fprintf(fp, "%f ", interest_points[i].descriptor[j]);
        }
        fprintf(fp, "\n");
    }
    fclose(fp);

	// Free memory
	stbi_image_free(image); // possibly move this to create_integral_img
	free(iimage->padded_data);
	free(iimage);
	for (int i = 0; i < NUM_LAYERS; ++i) {
		free(fh->response_map[i]->response);
		free(fh->response_map[i]->laplacian);
		free(fh->response_map[i]);
	}
	free(fh);

	return 0;
}